

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsmn.h
# Opt level: O0

int jsmn_parse(jsmn_parser *parser,char *js,size_t len,jsmntok_t *tokens,uint num_tokens)

{
  char cVar1;
  int iVar2;
  jsmntok_t *pjVar3;
  jsmntype_t jVar4;
  bool bVar5;
  jsmntok_t *t;
  jsmntype_t type;
  char c;
  int count;
  jsmntok_t *token;
  int i;
  int r;
  uint num_tokens_local;
  jsmntok_t *tokens_local;
  size_t len_local;
  char *js_local;
  jsmn_parser *parser_local;
  
  type = parser->toknext;
  while( true ) {
    bVar5 = false;
    if (parser->pos < len) {
      bVar5 = js[parser->pos] != '\0';
    }
    if (!bVar5) break;
    cVar1 = js[parser->pos];
    iVar2 = (int)cVar1;
    if (((1 < iVar2 - 9U) && (iVar2 != 0xd)) && (iVar2 != 0x20)) {
      if (iVar2 == 0x22) {
        iVar2 = jsmn_parse_string(parser,js,len,tokens,(ulong)num_tokens);
        if (iVar2 < 0) {
          return iVar2;
        }
        type = type + JSMN_OBJECT;
        if ((parser->toksuper != -1) && (tokens != (jsmntok_t *)0x0)) {
          tokens[parser->toksuper].size = tokens[parser->toksuper].size + 1;
        }
      }
      else if (iVar2 == 0x2c) {
        if (((tokens != (jsmntok_t *)0x0) && (parser->toksuper != -1)) &&
           ((tokens[parser->toksuper].type != JSMN_ARRAY &&
            (tokens[parser->toksuper].type != JSMN_OBJECT)))) {
          token._4_4_ = parser->toknext;
          do {
            token._4_4_ = token._4_4_ - 1;
            if ((int)token._4_4_ < 0) goto LAB_00109071;
          } while ((((tokens[(int)token._4_4_].type != JSMN_ARRAY) &&
                    (tokens[(int)token._4_4_].type != JSMN_OBJECT)) ||
                   (tokens[(int)token._4_4_].start == -1)) || (tokens[(int)token._4_4_].end != -1));
          parser->toksuper = token._4_4_;
        }
      }
      else if (iVar2 == 0x3a) {
        parser->toksuper = parser->toknext - 1;
      }
      else if (iVar2 == 0x5b) {
LAB_00108d0a:
        type = type + JSMN_OBJECT;
        if (tokens != (jsmntok_t *)0x0) {
          pjVar3 = jsmn_alloc_token(parser,tokens,(ulong)num_tokens);
          if (pjVar3 == (jsmntok_t *)0x0) {
            return -1;
          }
          if (parser->toksuper != -1) {
            tokens[parser->toksuper].size = tokens[parser->toksuper].size + 1;
          }
          jVar4 = JSMN_ARRAY;
          if (cVar1 == '{') {
            jVar4 = JSMN_OBJECT;
          }
          pjVar3->type = jVar4;
          pjVar3->start = parser->pos;
          parser->toksuper = parser->toknext - 1;
        }
      }
      else {
        if (iVar2 != 0x5d) {
          if (iVar2 == 0x7b) goto LAB_00108d0a;
          if (iVar2 != 0x7d) {
            iVar2 = jsmn_parse_primitive(parser,js,len,tokens,(ulong)num_tokens);
            if (iVar2 < 0) {
              return iVar2;
            }
            type = type + JSMN_OBJECT;
            if ((parser->toksuper != -1) && (tokens != (jsmntok_t *)0x0)) {
              tokens[parser->toksuper].size = tokens[parser->toksuper].size + 1;
            }
            goto LAB_00109071;
          }
        }
        if (tokens != (jsmntok_t *)0x0) {
          jVar4 = JSMN_ARRAY;
          if (cVar1 == '}') {
            jVar4 = JSMN_OBJECT;
          }
          token._4_4_ = parser->toknext;
          do {
            token._4_4_ = token._4_4_ - 1;
            if ((int)token._4_4_ < 0) goto LAB_00108e51;
            pjVar3 = tokens + (int)token._4_4_;
          } while ((pjVar3->start == -1) || (pjVar3->end != -1));
          if (pjVar3->type != jVar4) {
            return -2;
          }
          parser->toksuper = -1;
          pjVar3->end = parser->pos + 1;
LAB_00108e51:
          if (token._4_4_ == 0xffffffff) {
            return -2;
          }
          for (; -1 < (int)token._4_4_; token._4_4_ = token._4_4_ - 1) {
            if ((tokens[(int)token._4_4_].start != -1) && (tokens[(int)token._4_4_].end == -1)) {
              parser->toksuper = token._4_4_;
              break;
            }
          }
        }
      }
    }
LAB_00109071:
    parser->pos = parser->pos + 1;
  }
  if (tokens == (jsmntok_t *)0x0) {
LAB_001090df:
    parser_local._4_4_ = type;
  }
  else {
    token._4_4_ = parser->toknext;
    do {
      token._4_4_ = token._4_4_ - 1;
      if ((int)token._4_4_ < 0) goto LAB_001090df;
    } while ((tokens[(int)token._4_4_].start == -1) || (tokens[(int)token._4_4_].end != -1));
    parser_local._4_4_ = ~JSMN_ARRAY;
  }
  return parser_local._4_4_;
}

Assistant:

JSMN_API int jsmn_parse(jsmn_parser *parser, const char *js, const size_t len,
                        jsmntok_t *tokens, const unsigned int num_tokens) {
  int r;
  int i;
  jsmntok_t *token;
  int count = parser->toknext;

  for (; parser->pos < len && js[parser->pos] != '\0'; parser->pos++) {
    char c;
    jsmntype_t type;

    c = js[parser->pos];
    switch (c) {
    case '{':
    case '[':
      count++;
      if (tokens == NULL) {
        break;
      }
      token = jsmn_alloc_token(parser, tokens, num_tokens);
      if (token == NULL) {
        return JSMN_ERROR_NOMEM;
      }
      if (parser->toksuper != -1) {
        jsmntok_t *t = &tokens[parser->toksuper];
#ifdef JSMN_STRICT
        /* In strict mode an object or array can't become a key */
        if (t->type == JSMN_OBJECT) {
          return JSMN_ERROR_INVAL;
        }
#endif
        t->size++;
#ifdef JSMN_PARENT_LINKS
        token->parent = parser->toksuper;
#endif
      }
      token->type = (c == '{' ? JSMN_OBJECT : JSMN_ARRAY);
      token->start = parser->pos;
      parser->toksuper = parser->toknext - 1;
      break;
    case '}':
    case ']':
      if (tokens == NULL) {
        break;
      }
      type = (c == '}' ? JSMN_OBJECT : JSMN_ARRAY);
#ifdef JSMN_PARENT_LINKS
      if (parser->toknext < 1) {
        return JSMN_ERROR_INVAL;
      }
      token = &tokens[parser->toknext - 1];
      for (;;) {
        if (token->start != -1 && token->end == -1) {
          if (token->type != type) {
            return JSMN_ERROR_INVAL;
          }
          token->end = parser->pos + 1;
          parser->toksuper = token->parent;
          break;
        }
        if (token->parent == -1) {
          if (token->type != type || parser->toksuper == -1) {
            return JSMN_ERROR_INVAL;
          }
          break;
        }
        token = &tokens[token->parent];
      }
#else
      for (i = parser->toknext - 1; i >= 0; i--) {
        token = &tokens[i];
        if (token->start != -1 && token->end == -1) {
          if (token->type != type) {
            return JSMN_ERROR_INVAL;
          }
          parser->toksuper = -1;
          token->end = parser->pos + 1;
          break;
        }
      }
      /* Error if unmatched closing bracket */
      if (i == -1) {
        return JSMN_ERROR_INVAL;
      }
      for (; i >= 0; i--) {
        token = &tokens[i];
        if (token->start != -1 && token->end == -1) {
          parser->toksuper = i;
          break;
        }
      }
#endif
      break;
    case '\"':
      r = jsmn_parse_string(parser, js, len, tokens, num_tokens);
      if (r < 0) {
        return r;
      }
      count++;
      if (parser->toksuper != -1 && tokens != NULL) {
        tokens[parser->toksuper].size++;
      }
      break;
    case '\t':
    case '\r':
    case '\n':
    case ' ':
      break;
    case ':':
      parser->toksuper = parser->toknext - 1;
      break;
    case ',':
      if (tokens != NULL && parser->toksuper != -1 &&
          tokens[parser->toksuper].type != JSMN_ARRAY &&
          tokens[parser->toksuper].type != JSMN_OBJECT) {
#ifdef JSMN_PARENT_LINKS
        parser->toksuper = tokens[parser->toksuper].parent;
#else
        for (i = parser->toknext - 1; i >= 0; i--) {
          if (tokens[i].type == JSMN_ARRAY || tokens[i].type == JSMN_OBJECT) {
            if (tokens[i].start != -1 && tokens[i].end == -1) {
              parser->toksuper = i;
              break;
            }
          }
        }
#endif
      }
      break;
#ifdef JSMN_STRICT
    /* In strict mode primitives are: numbers and booleans */
    case '-':
    case '0':
    case '1':
    case '2':
    case '3':
    case '4':
    case '5':
    case '6':
    case '7':
    case '8':
    case '9':
    case 't':
    case 'f':
    case 'n':
      /* And they must not be keys of the object */
      if (tokens != NULL && parser->toksuper != -1) {
        const jsmntok_t *t = &tokens[parser->toksuper];
        if (t->type == JSMN_OBJECT ||
            (t->type == JSMN_STRING && t->size != 0)) {
          return JSMN_ERROR_INVAL;
        }
      }
#else
    /* In non-strict mode every unquoted value is a primitive */
    default:
#endif
      r = jsmn_parse_primitive(parser, js, len, tokens, num_tokens);
      if (r < 0) {
        return r;
      }
      count++;
      if (parser->toksuper != -1 && tokens != NULL) {
        tokens[parser->toksuper].size++;
      }
      break;

#ifdef JSMN_STRICT
    /* Unexpected char in strict mode */
    default:
      return JSMN_ERROR_INVAL;
#endif
    }
  }

  if (tokens != NULL) {
    for (i = parser->toknext - 1; i >= 0; i--) {
      /* Unmatched opened object or array */
      if (tokens[i].start != -1 && tokens[i].end == -1) {
        return JSMN_ERROR_PART;
      }
    }
  }

  return count;
}